

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O3

void initialize_regressor<sparse_parameters>(vw *all,sparse_parameters *weights)

{
  uint32_t stride_shift;
  uint32_t uVar1;
  float *pfVar2;
  code *pcVar3;
  ostream *poVar4;
  vw_exception *this;
  stringstream __msg;
  string asStack_1e8 [2];
  stringstream local_1a8 [16];
  ostream local_198;
  
  if ((weights->_weight_mask == 0) || ((weights->_map)._M_h._M_element_count == 0)) {
    uVar1 = all->num_bits;
    stride_shift = weights->_stride_shift;
    sparse_parameters::~sparse_parameters(weights);
    sparse_parameters::sparse_parameters(weights,1L << ((byte)uVar1 & 0x3f),stride_shift);
    if (weights->_weight_mask == 0) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_198," Failed to allocate weight array with ",0x26);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4," bits: try decreasing -b <bits>",0x1f);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_regressor.cc"
                 ,0x74,asStack_1e8);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    if ((all->initial_weight != 0.0) || (NAN(all->initial_weight))) {
      pfVar2 = calloc_or_throw<float>(1);
      *pfVar2 = all->initial_weight;
      weights->default_data = pfVar2;
      weights->fun = set_initial_wrapper<sparse_parameters>::func;
      *weights->default_value = *pfVar2;
    }
    else {
      if (all->random_positive_weights == true) {
        pcVar3 = random_positive_wrapper<sparse_parameters>::func;
      }
      else if (all->random_weights == true) {
        pcVar3 = random_weights_wrapper<sparse_parameters>::func;
      }
      else {
        if (all->normal_weights != true) {
          if (all->tnormal_weights != true) {
            return;
          }
          weights->fun = polar_normal_weights_wrapper<sparse_parameters>::func;
          truncate<sparse_parameters>(all,weights);
          return;
        }
        pcVar3 = polar_normal_weights_wrapper<sparse_parameters>::func;
      }
      weights->fun = pcVar3;
    }
  }
  return;
}

Assistant:

void initialize_regressor(vw& all, T& weights)
{
  // Regressor is already initialized.

  if (weights.not_null())
    return;
  size_t length = ((size_t)1) << all.num_bits;
  try
  {
    uint32_t ss = weights.stride_shift();
    weights.~T();  // dealloc so that we can realloc, now with a known size
    new (&weights) T(length, ss);
  }
  catch (const VW::vw_exception&)
  {
    THROW(" Failed to allocate weight array with " << all.num_bits << " bits: try decreasing -b <bits>");
  }
  if (weights.mask() == 0)
  {
    THROW(" Failed to allocate weight array with " << all.num_bits << " bits: try decreasing -b <bits>");
  }
  else if (all.initial_weight != 0.)
    weights.template set_default<float, set_initial_wrapper<T> >(all.initial_weight);
  else if (all.random_positive_weights)
    weights.template set_default<random_positive_wrapper<T> >();
  else if (all.random_weights)
    weights.template set_default<random_weights_wrapper<T> >();
  else if (all.normal_weights)
  {
    weights.template set_default<polar_normal_weights_wrapper<T> >();
  }
  else if (all.tnormal_weights)
  {
    weights.template set_default<polar_normal_weights_wrapper<T> >();
    truncate(all, weights);
  }
}